

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O3

int asn1_item_ex_d2i(ASN1_VALUE **pval,uchar **in,long len,ASN1_ITEM *it,int tag,int aclass,char opt
                    ,CRYPTO_BUFFER *buf,int depth)

{
  uint8_t *puVar1;
  long lVar2;
  uchar *puVar3;
  ASN1_ITEM *it_00;
  byte opt_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint8_t *puVar7;
  size_t sVar8;
  ASN1_VALUE **ppAVar9;
  ASN1_TEMPLATE *tt;
  ulong uVar10;
  int iVar11;
  ASN1_TEMPLATE *pAVar12;
  code *pcVar13;
  undefined1 *puVar14;
  ASN1_TEMPLATE *pAVar15;
  uchar oclass;
  uchar *p;
  char cst;
  uchar local_79;
  uchar **local_78;
  CRYPTO_BUFFER *local_70;
  uchar *local_68;
  undefined8 local_60;
  uchar *local_58;
  int local_4c;
  code *local_48;
  code *local_40;
  ASN1_ITEM *local_38;
  
  local_68 = (uchar *)0x0;
  if (pval == (ASN1_VALUE **)0x0) {
    return 0;
  }
  local_78 = (uchar **)CONCAT44(local_78._4_4_,tag);
  local_60 = CONCAT44(local_60._4_4_,aclass);
  local_70 = (CRYPTO_BUFFER *)CONCAT71(local_70._1_7_,opt);
  local_58 = (uchar *)len;
  local_38 = (ASN1_ITEM *)it;
  if (buf != (CRYPTO_BUFFER *)0x0) {
    puVar7 = CRYPTO_BUFFER_data(buf);
    puVar1 = *in;
    if (puVar1 < puVar7) {
LAB_0044484f:
      __assert_fail("CRYPTO_BUFFER_data(buf) <= *in && *in + len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0xa7,
                    "int asn1_item_ex_d2i(ASN1_VALUE **, const unsigned char **, long, const ASN1_ITEM *, int, int, char, CRYPTO_BUFFER *, int)"
                   );
    }
    puVar7 = CRYPTO_BUFFER_data(buf);
    sVar8 = CRYPTO_BUFFER_len(buf);
    if (puVar7 + sVar8 < puVar1 + len) goto LAB_0044484f;
  }
  it_00 = local_38;
  if (0x3fffffff < len) {
    local_58 = (uchar *)0x3fffffff;
    len = 0x3fffffff;
  }
  if (0x1d < depth) {
    iVar11 = 0xc0;
    iVar4 = 0xb1;
    goto LAB_00443f95;
  }
  if (5 < (byte)local_38->itype) {
    return 0;
  }
  iVar11 = depth + 1;
  switch(local_38->itype) {
  case '\0':
    if ((ASN1_TEMPLATE *)local_38->utype == (ASN1_TEMPLATE *)0x0) {
      iVar11 = asn1_d2i_ex_primitive
                         (pval,in,len,(ASN1_ITEM *)local_38,(int)local_78,(int)local_60,
                          (char)local_70);
      return iVar11;
    }
    if ((int)local_78 == -1 && (char)local_70 == '\0') {
      iVar11 = asn1_template_ex_d2i(pval,in,len,(ASN1_TEMPLATE *)local_38->utype,'\0',buf,iVar11);
      return iVar11;
    }
    iVar11 = 0x88;
    iVar4 = 0xbd;
    goto LAB_00444385;
  case '\x01':
    local_68 = *in;
    iVar4 = (int)local_60;
    if ((int)local_78 == -1) {
      iVar4 = 0;
    }
    iVar5 = 0x10;
    if ((int)local_78 != -1) {
      iVar5 = (int)local_78;
    }
    iVar4 = asn1_check_tlen((long *)&local_58,(int *)0x0,(uchar *)0x0,(char *)&local_4c,&local_68,
                            len,iVar5,iVar4,(char)local_70);
    if (iVar4 == -1) {
      return -1;
    }
    if (iVar4 == 0) {
      iVar11 = 0x9e;
      iVar4 = 0x143;
      break;
    }
    if ((char)local_4c == '\0') {
      iVar11 = 0xa9;
      iVar4 = 0x149;
      local_78 = in;
    }
    else {
      local_78 = in;
      if ((*pval != (ASN1_VALUE *)0x0) ||
         (iVar5 = ASN1_item_ex_new((ASN1_VALUE **)pval,it_00), iVar5 != 0)) {
        pcVar13 = (code *)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
        if ((it_00->tcount == 0) ||
           (local_40 = *(code **)(it_00->tcount + 0x10), local_40 == (code *)0x0)) {
          local_40 = (code *)0x0;
        }
        else {
          pcVar13 = (code *)0x0;
          iVar4 = (*local_40)(4,pval,it_00,0);
          if (iVar4 == 0) goto LAB_004447bb;
        }
        local_70 = buf;
        pAVar12 = (ASN1_TEMPLATE *)it_00->utype;
        pAVar15 = it_00->templates;
        puVar14 = (undefined1 *)0x0;
        local_48 = pcVar13;
        if (0 < (long)pAVar15) {
          do {
            if (((pAVar12->flags & 0x300) != 0) &&
               (pAVar15 = asn1_do_adb((ASN1_VALUE **)pval,pAVar12,0),
               pAVar15 != (ASN1_TEMPLATE *)0x0)) {
              ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar15);
              ASN1_template_free(ppAVar9,pAVar15);
            }
            puVar14 = puVar14 + 1;
            pAVar12 = (ASN1_TEMPLATE *)&pAVar12->item;
            pAVar15 = it_00->templates;
          } while ((long)puVar14 < (long)pAVar15);
          pAVar12 = (ASN1_TEMPLATE *)it_00->utype;
          if ((long)pAVar15 < 1) {
            puVar14 = (undefined1 *)0x0;
          }
          else {
            local_60 = CONCAT44(local_60._4_4_,iVar11);
            puVar14 = (undefined1 *)0x0;
            do {
              tt = asn1_do_adb((ASN1_VALUE **)pval,pAVar12,1);
              if (tt == (ASN1_TEMPLATE *)0x0) goto LAB_00443fa2;
              ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)pval,tt);
              puVar3 = local_68;
              if (local_58 == (uchar *)0x0) {
                pAVar15 = it_00->templates;
                goto LAB_00444725;
              }
              if (puVar14 == (undefined1 *)((long)&it_00->templates[-1].item + 7U)) {
                opt_00 = 0;
              }
              else {
                opt_00 = (byte)tt->flags & 1;
              }
              iVar11 = asn1_template_ex_d2i
                                 ((ASN1_VALUE **)ppAVar9,&local_68,(long)local_58,
                                  (ASN1_TEMPLATE *)tt,opt_00,local_70,(int)local_60);
              if (iVar11 == -1) {
                ASN1_template_free(ppAVar9,tt);
              }
              else {
                if (iVar11 == 0) goto LAB_00444819;
                local_58 = puVar3 + ((long)local_58 - (long)local_68);
              }
              puVar14 = puVar14 + 1;
              pAVar12 = (ASN1_TEMPLATE *)&pAVar12->item;
              pAVar15 = it_00->templates;
            } while ((long)puVar14 < (long)pAVar15);
          }
        }
        if (local_58 == (uchar *)0x0) {
LAB_00444725:
          uVar10 = (ulong)puVar14 & 0xffffffff;
          if ((long)uVar10 < (long)pAVar15) {
            do {
              tt = asn1_do_adb((ASN1_VALUE **)pval,pAVar12,1);
              if (tt == (ASN1_TEMPLATE *)0x0) goto LAB_00443fa2;
              if ((tt->flags & 1) == 0) {
                ERR_put_error(0xc,0,0x79,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                              ,0x1a1);
LAB_00444819:
                ASN1_item_ex_free((ASN1_VALUE **)pval,it_00);
LAB_00444824:
                ERR_add_error_data(4,"Field=",tt->offset,", Type=",it_00->size);
                return 0;
              }
              ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)pval,tt);
              ASN1_template_free(ppAVar9,tt);
              pAVar12 = (ASN1_TEMPLATE *)&pAVar12->item;
              uVar10 = uVar10 + 1;
            } while ((long)uVar10 < (long)it_00->templates);
          }
          iVar11 = asn1_enc_save((ASN1_VALUE **)pval,*local_78,(int)local_68 - (int)*local_78,it_00)
          ;
          if (iVar11 == 0) goto LAB_004447bb;
          if ((char)local_48 != '\0') goto LAB_004447a3;
          iVar11 = (*local_40)(5,pval,it_00,0);
LAB_0044460c:
          if (iVar11 != 0) {
LAB_004447a3:
            *local_78 = local_68;
            return 1;
          }
          goto LAB_004447bb;
        }
        ERR_put_error(0xc,0,0xa8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x18e);
        goto LAB_00443fa2;
      }
      iVar11 = 0x9e;
      iVar4 = 0x14e;
    }
LAB_00444385:
    ERR_put_error(0xc,0,iVar11,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                  ,iVar4);
    goto LAB_00443fa2;
  case '\x02':
    if ((int)local_78 == -1) {
      lVar2 = local_38->tcount;
      if ((lVar2 == 0) || (pcVar13 = *(code **)(lVar2 + 0x10), pcVar13 == (code *)0x0)) {
        local_60 = CONCAT71((int7)((ulong)lVar2 >> 8),1);
        pcVar13 = (code *)0x0;
        local_78 = in;
LAB_004442ee:
        if (*pval == (ASN1_VALUE *)0x0) {
          iVar4 = ASN1_item_ex_new((ASN1_VALUE **)pval,it_00);
          if (iVar4 != 0) goto LAB_0044439f;
          iVar11 = 0x9e;
          iVar4 = 0x10d;
        }
        else {
          uVar6 = asn1_get_choice_selector((ASN1_VALUE **)pval,it_00);
          if ((-1 < (int)uVar6) && ((long)(ulong)uVar6 < (long)it_00->templates)) {
            pAVar15 = (ASN1_TEMPLATE *)((ulong)uVar6 * 0x20 + it_00->utype);
            ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar15);
            ASN1_template_free(ppAVar9,pAVar15);
            asn1_set_choice_selector((ASN1_VALUE **)pval,-1,it_00);
          }
LAB_0044439f:
          local_68 = *local_78;
          pAVar15 = it_00->templates;
          if ((long)pAVar15 < 1) {
            iVar11 = 0;
            pAVar12 = (ASN1_TEMPLATE *)0x0;
          }
          else {
            tt = (ASN1_TEMPLATE *)it_00->utype;
            pAVar12 = (ASN1_TEMPLATE *)0x0;
            local_48 = pcVar13;
            do {
              ppAVar9 = asn1_get_field_ptr((ASN1_VALUE **)pval,tt);
              iVar4 = asn1_template_ex_d2i
                                ((ASN1_VALUE **)ppAVar9,&local_68,(long)local_58,(ASN1_TEMPLATE *)tt
                                 ,'\x01',buf,iVar11);
              pcVar13 = local_48;
              if (iVar4 != -1) {
                if (iVar4 < 1) {
                  ERR_put_error(0xc,0,0x9e,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                                ,0x120);
                  ASN1_item_ex_free((ASN1_VALUE **)pval,it_00);
                  if (tt == (ASN1_TEMPLATE *)0x0) goto LAB_00443faa;
                  goto LAB_00444824;
                }
                pAVar15 = it_00->templates;
                iVar11 = (int)pAVar12;
                goto LAB_004445be;
              }
              pAVar12 = (ASN1_TEMPLATE *)((long)&pAVar12->flags + 1);
              tt = (ASN1_TEMPLATE *)&tt->item;
              pAVar15 = it_00->templates;
            } while ((long)pAVar12 < (long)pAVar15);
            iVar11 = (int)pAVar12;
          }
LAB_004445be:
          if (pAVar15 != pAVar12) {
            asn1_set_choice_selector((ASN1_VALUE **)pval,iVar11,it_00);
            if ((char)local_60 != '\0') goto LAB_004447a3;
            iVar11 = (*pcVar13)(5,pval,it_00,0);
            goto LAB_0044460c;
          }
          if ((char)local_70 != '\0') {
            ASN1_item_ex_free((ASN1_VALUE **)pval,it_00);
            return -1;
          }
          iVar11 = 0xa3;
          iVar4 = 300;
        }
        ERR_put_error(0xc,0,iVar11,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,iVar4);
      }
      else {
        local_60 = 0;
        local_78 = in;
        iVar4 = (*pcVar13)(4,pval,local_38,0);
        if (iVar4 != 0) goto LAB_004442ee;
LAB_004447bb:
        ERR_put_error(0xc,0,0x65,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x1b4);
      }
      goto LAB_00443fa2;
    }
    iVar11 = 0xc1;
    iVar4 = 0xf9;
    break;
  case '\x03':
    goto LAB_00443fc8;
  case '\x04':
    if ((int)local_78 == -1) {
      iVar11 = (**(code **)(local_38->tcount + 0x10))(pval,in,len,local_38,(int)(char)local_70,0);
      return iVar11;
    }
    iVar11 = 0xc1;
    iVar4 = 0xed;
    break;
  case '\x05':
    if ((int)local_78 == -1) {
      local_68 = *in;
      iVar11 = asn1_check_tlen((long *)0x0,&local_4c,&local_79,(char *)0x0,&local_68,len,-1,0,'\x01'
                              );
      if (iVar11 == 0) {
        iVar11 = 0x9e;
        iVar4 = 0xd2;
        goto LAB_00444385;
      }
      if (local_79 == '\0') {
        uVar10 = ASN1_tag2bit(local_4c);
        if ((*(uint *)&it_00->field_0x4 & (uint)uVar10) != 0) {
          iVar11 = asn1_d2i_ex_primitive(pval,in,(long)local_58,(ASN1_ITEM *)it_00,local_4c,0,'\0');
          return iVar11;
        }
        if ((char)local_70 != '\0') {
          return -1;
        }
        iVar11 = 0x9d;
        iVar4 = 0xe5;
      }
      else {
        if ((char)local_70 != '\0') {
          return -1;
        }
        iVar11 = 0x9c;
        iVar4 = 0xdc;
      }
    }
    else {
      iVar11 = 0xc1;
      iVar4 = 0xca;
    }
  }
LAB_00443f95:
  ERR_put_error(0xc,0,iVar11,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                ,iVar4);
LAB_00443fa2:
  ASN1_item_ex_free((ASN1_VALUE **)pval,it_00);
LAB_00443faa:
  ERR_add_error_data(2,"Type=",it_00->size);
LAB_00443fc8:
  return 0;
}

Assistant:

static int asn1_item_ex_d2i(ASN1_VALUE **pval, const unsigned char **in,
                            long len, const ASN1_ITEM *it, int tag, int aclass,
                            char opt, CRYPTO_BUFFER *buf, int depth) {
  const ASN1_TEMPLATE *tt, *errtt = NULL;
  const unsigned char *p = NULL, *q;
  unsigned char oclass;
  char cst, isopt;
  int i;
  int otag;
  int ret = 0;
  ASN1_VALUE **pchptr;
  if (!pval) {
    return 0;
  }

  if (buf != NULL) {
    assert(CRYPTO_BUFFER_data(buf) <= *in &&
           *in + len <= CRYPTO_BUFFER_data(buf) + CRYPTO_BUFFER_len(buf));
  }

  // Bound |len| to comfortably fit in an int. Lengths in this module often
  // switch between int and long without overflow checks.
  if (len > INT_MAX / 2) {
    len = INT_MAX / 2;
  }

  if (++depth > ASN1_MAX_CONSTRUCTED_NEST) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_TOO_DEEP);
    goto err;
  }

  switch (it->itype) {
    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        // tagging or OPTIONAL is currently illegal on an item template
        // because the flags can't get passed down. In practice this
        // isn't a problem: we include the relevant flags from the item
        // template in the template itself.
        if ((tag != -1) || opt) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OPTIONS_ON_ITEM_TEMPLATE);
          goto err;
        }
        return asn1_template_ex_d2i(pval, in, len, it->templates, opt, buf,
                                    depth);
      }
      return asn1_d2i_ex_primitive(pval, in, len, it, tag, aclass, opt);
      break;

    case ASN1_ITYPE_MSTRING:
      // It never makes sense for multi-strings to have implicit tagging, so
      // if tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }

      p = *in;
      // Just read in tag and class
      ret = asn1_check_tlen(NULL, &otag, &oclass, NULL, &p, len, -1, 0, 1);
      if (!ret) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      // Must be UNIVERSAL class
      if (oclass != V_ASN1_UNIVERSAL) {
        // If OPTIONAL, assume this is OK
        if (opt) {
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_MSTRING_NOT_UNIVERSAL);
        goto err;
      }
      // Check tag matches bit map
      if (!(ASN1_tag2bit(otag) & it->utype)) {
        // If OPTIONAL, assume this is OK
        if (opt) {
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_MSTRING_WRONG_TAG);
        goto err;
      }
      return asn1_d2i_ex_primitive(pval, in, len, it, otag, 0, 0);

    case ASN1_ITYPE_EXTERN: {
      // We don't support implicit tagging with external types.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }
      const ASN1_EXTERN_FUNCS *ef =
          reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      return ef->asn1_ex_d2i(pval, in, len, it, opt, NULL);
    }

    case ASN1_ITYPE_CHOICE: {
      // It never makes sense for CHOICE types to have implicit tagging, so if
      // tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        goto err;
      }

      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_PRE, pval, it, NULL)) {
        goto auxerr;
      }

      if (*pval) {
        // Free up and zero CHOICE value if initialised
        i = asn1_get_choice_selector(pval, it);
        if ((i >= 0) && (i < it->tcount)) {
          tt = it->templates + i;
          pchptr = asn1_get_field_ptr(pval, tt);
          ASN1_template_free(pchptr, tt);
          asn1_set_choice_selector(pval, -1, it);
        }
      } else if (!ASN1_item_ex_new(pval, it)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }
      // CHOICE type, try each possibility in turn
      p = *in;
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        pchptr = asn1_get_field_ptr(pval, tt);
        // We mark field as OPTIONAL so its absence can be recognised.
        ret = asn1_template_ex_d2i(pchptr, &p, len, tt, 1, buf, depth);
        // If field not present, try the next one
        if (ret == -1) {
          continue;
        }
        // If positive return, read OK, break loop
        if (ret > 0) {
          break;
        }
        // Otherwise must be an ASN1 parsing error
        errtt = tt;
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      // Did we fall off the end without reading anything?
      if (i == it->tcount) {
        // If OPTIONAL, this is OK
        if (opt) {
          // Free and zero it
          ASN1_item_ex_free(pval, it);
          return -1;
        }
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NO_MATCHING_CHOICE_TYPE);
        goto err;
      }

      asn1_set_choice_selector(pval, i, it);
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_POST, pval, it, NULL)) {
        goto auxerr;
      }
      *in = p;
      return 1;
    }

    case ASN1_ITYPE_SEQUENCE: {
      p = *in;

      // If no IMPLICIT tagging set to SEQUENCE, UNIVERSAL
      if (tag == -1) {
        tag = V_ASN1_SEQUENCE;
        aclass = V_ASN1_UNIVERSAL;
      }
      // Get SEQUENCE length and update len, p
      ret = asn1_check_tlen(&len, NULL, NULL, &cst, &p, len, tag, aclass, opt);
      if (!ret) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      } else if (ret == -1) {
        return -1;
      }
      if (!cst) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_NOT_CONSTRUCTED);
        goto err;
      }

      if (!*pval && !ASN1_item_ex_new(pval, it)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }

      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_PRE, pval, it, NULL)) {
        goto auxerr;
      }

      // Free up and zero any ADB found
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        if (tt->flags & ASN1_TFLG_ADB_MASK) {
          const ASN1_TEMPLATE *seqtt;
          ASN1_VALUE **pseqval;
          seqtt = asn1_do_adb(pval, tt, 0);
          if (seqtt == NULL) {
            continue;
          }
          pseqval = asn1_get_field_ptr(pval, seqtt);
          ASN1_template_free(pseqval, seqtt);
        }
      }

      // Get each field entry
      for (i = 0, tt = it->templates; i < it->tcount; i++, tt++) {
        const ASN1_TEMPLATE *seqtt;
        ASN1_VALUE **pseqval;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (seqtt == NULL) {
          goto err;
        }
        pseqval = asn1_get_field_ptr(pval, seqtt);
        // Have we ran out of data?
        if (!len) {
          break;
        }
        q = p;
        // This determines the OPTIONAL flag value. The field cannot be
        // omitted if it is the last of a SEQUENCE and there is still
        // data to be read. This isn't strictly necessary but it
        // increases efficiency in some cases.
        if (i == (it->tcount - 1)) {
          isopt = 0;
        } else {
          isopt = (seqtt->flags & ASN1_TFLG_OPTIONAL) != 0;
        }
        // attempt to read in field, allowing each to be OPTIONAL

        ret = asn1_template_ex_d2i(pseqval, &p, len, seqtt, isopt, buf, depth);
        if (!ret) {
          errtt = seqtt;
          goto err;
        } else if (ret == -1) {
          // OPTIONAL component absent. Free and zero the field.
          ASN1_template_free(pseqval, seqtt);
          continue;
        }
        // Update length
        len -= p - q;
      }

      // Check all data read
      if (len) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_LENGTH_MISMATCH);
        goto err;
      }

      // If we get here we've got no more data in the SEQUENCE, however we
      // may not have read all fields so check all remaining are OPTIONAL
      // and clear any that are.
      for (; i < it->tcount; tt++, i++) {
        const ASN1_TEMPLATE *seqtt;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (seqtt == NULL) {
          goto err;
        }
        if (seqtt->flags & ASN1_TFLG_OPTIONAL) {
          ASN1_VALUE **pseqval;
          pseqval = asn1_get_field_ptr(pval, seqtt);
          ASN1_template_free(pseqval, seqtt);
        } else {
          errtt = seqtt;
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_FIELD_MISSING);
          goto err;
        }
      }
      // Save encoding
      if (!asn1_enc_save(pval, *in, p - *in, it, buf)) {
        goto auxerr;
      }
      if (asn1_cb && !asn1_cb(ASN1_OP_D2I_POST, pval, it, NULL)) {
        goto auxerr;
      }
      *in = p;
      return 1;
    }

    default:
      return 0;
  }
auxerr:
  OPENSSL_PUT_ERROR(ASN1, ASN1_R_AUX_ERROR);
err:
  ASN1_item_ex_free(pval, it);
  if (errtt) {
    ERR_add_error_data(4, "Field=", errtt->field_name, ", Type=", it->sname);
  } else {
    ERR_add_error_data(2, "Type=", it->sname);
  }
  return 0;
}